

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O2

bool __thiscall QPDF::read_bad_xrefEntry(QPDF *this,qpdf_offset_t *f1,int *f2,char *type)

{
  InputSource *this_00;
  int *piVar1;
  byte bVar2;
  int iVar3;
  qpdf_offset_t qVar4;
  longlong lVar5;
  byte bVar6;
  bool bVar7;
  byte *pbVar8;
  allocator<char> local_16a;
  allocator<char> local_169;
  int *local_168;
  longlong *local_160;
  byte *local_158;
  string f2_str;
  string f1_str;
  string local_110;
  string local_f0;
  string line;
  QPDFExc local_b0;
  
  this_00 = (((this->m)._M_t.
              super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
              super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
              super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
            super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_160 = f1;
  local_158 = (byte *)type;
  qVar4 = InputSource::getLastOffset(this_00);
  bVar6 = 0;
  (*this_00->_vptr_InputSource[5])(this_00,qVar4,0);
  InputSource::readLine_abi_cxx11_
            (&line,(((this->m)._M_t.
                     super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                     super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                     super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->file).
                   super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0x1e);
  while( true ) {
    pbVar8 = (byte *)line._M_dataplus._M_p + 1;
    bVar2 = *line._M_dataplus._M_p;
    if ((0x20 < (ulong)bVar2) || ((0x100003e00U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) break;
    bVar6 = 1;
    line._M_dataplus._M_p = (pointer)pbVar8;
  }
  if ((byte)(bVar2 - 0x30) < 10) {
    f1_str._M_dataplus._M_p = (pointer)&f1_str.field_2;
    f1_str._M_string_length = 0;
    f1_str.field_2._M_local_buf[0] = '\0';
    local_168 = f2;
    for (; bVar2 = pbVar8[-1], (byte)(bVar2 - 0x30) < 10; pbVar8 = pbVar8 + 1) {
      std::__cxx11::string::append((ulong)&f1_str,'\x01');
    }
    bVar7 = false;
    if ((bVar2 < 0x21) && (bVar7 = false, (0x100003e00U >> ((ulong)(uint)bVar2 & 0x3f) & 1) != 0)) {
      if ((byte)(*pbVar8 - 9) < 0x18) {
        bVar6 = bVar6 | (byte)(0x80001f >> (*pbVar8 - 9 & 0x1f));
      }
      while ((bVar2 < 0x21 && ((0x100003e00U >> ((ulong)bVar2 & 0x3f) & 1) != 0))) {
        bVar2 = *pbVar8;
        pbVar8 = pbVar8 + 1;
      }
      if ((byte)(bVar2 - 0x30) < 10) {
        f2_str._M_dataplus._M_p = (pointer)&f2_str.field_2;
        f2_str._M_string_length = 0;
        f2_str.field_2._M_local_buf[0] = '\0';
        for (; piVar1 = local_168, bVar2 = pbVar8[-1], (byte)(bVar2 - 0x30) < 10;
            pbVar8 = pbVar8 + 1) {
          std::__cxx11::string::append((ulong)&f2_str,'\x01');
        }
        bVar7 = false;
        if ((bVar2 < 0x21) &&
           (bVar7 = false, (0x100003e00U >> ((ulong)(uint)bVar2 & 0x3f) & 1) != 0)) {
          if ((byte)(*pbVar8 - 9) < 0x18) {
            bVar6 = (byte)(0x80001f >> (*pbVar8 - 9 & 0x1f)) | bVar6;
          }
          while ((bVar2 < 0x21 && ((0x100003e00U >> ((ulong)bVar2 & 0x3f) & 1) != 0))) {
            bVar2 = *pbVar8;
            pbVar8 = pbVar8 + 1;
          }
          if ((bVar2 == 0x66) || (bVar2 == 0x6e)) {
            *local_158 = bVar2;
            if ((bVar6 & 1) != 0 || (f2_str._M_string_length != 5 || f1_str._M_string_length != 10))
            {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_f0,"xref table",&local_169);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_110,"accepting invalid xref table entry",&local_16a);
              damagedPDF(&local_b0,this,&local_f0,&local_110);
              warn(this,&local_b0);
              QPDFExc::~QPDFExc(&local_b0);
              std::__cxx11::string::~string((string *)&local_110);
              std::__cxx11::string::~string((string *)&local_f0);
            }
            lVar5 = QUtil::string_to_ll(f1_str._M_dataplus._M_p);
            *local_160 = lVar5;
            iVar3 = QUtil::string_to_int(f2_str._M_dataplus._M_p);
            *piVar1 = iVar3;
            bVar7 = true;
          }
          else {
            bVar7 = false;
          }
        }
        std::__cxx11::string::~string((string *)&f2_str);
      }
      else {
        bVar7 = false;
      }
    }
    std::__cxx11::string::~string((string *)&f1_str);
  }
  else {
    bVar7 = false;
  }
  std::__cxx11::string::~string((string *)&line);
  return bVar7;
}

Assistant:

bool
QPDF::read_bad_xrefEntry(qpdf_offset_t& f1, int& f2, char& type)
{
    // Reposition after initial read attempt and reread.
    m->file->seek(m->file->getLastOffset(), SEEK_SET);
    auto line = m->file->readLine(30);

    // is_space and is_digit both return false on '\0', so this will not overrun the null-terminated
    // buffer.
    char const* p = line.data();

    // Skip zero or more spaces. There aren't supposed to be any.
    bool invalid = false;
    while (util::is_space(*p)) {
        ++p;
        QTC::TC("qpdf", "QPDF ignore first space in xref entry");
        invalid = true;
    }
    // Require digit
    if (!util::is_digit(*p)) {
        return false;
    }
    // Gather digits
    std::string f1_str;
    while (util::is_digit(*p)) {
        f1_str.append(1, *p++);
    }
    // Require space
    if (!util::is_space(*p)) {
        return false;
    }
    if (util::is_space(*(p + 1))) {
        QTC::TC("qpdf", "QPDF ignore first extra space in xref entry");
        invalid = true;
    }
    // Skip spaces
    while (util::is_space(*p)) {
        ++p;
    }
    // Require digit
    if (!util::is_digit(*p)) {
        return false;
    }
    // Gather digits
    std::string f2_str;
    while (util::is_digit(*p)) {
        f2_str.append(1, *p++);
    }
    // Require space
    if (!util::is_space(*p)) {
        return false;
    }
    if (util::is_space(*(p + 1))) {
        QTC::TC("qpdf", "QPDF ignore second extra space in xref entry");
        invalid = true;
    }
    // Skip spaces
    while (util::is_space(*p)) {
        ++p;
    }
    if ((*p == 'f') || (*p == 'n')) {
        type = *p;
    } else {
        return false;
    }
    if ((f1_str.length() != 10) || (f2_str.length() != 5)) {
        QTC::TC("qpdf", "QPDF ignore length error xref entry");
        invalid = true;
    }

    if (invalid) {
        warn(damagedPDF("xref table", "accepting invalid xref table entry"));
    }

    f1 = QUtil::string_to_ll(f1_str.c_str());
    f2 = QUtil::string_to_int(f2_str.c_str());

    return true;
}